

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

ERR_SAVE_STATE * ERR_save_state(void)

{
  ERR_STATE *pEVar1;
  char *pcVar2;
  char *pcVar3;
  uint local_3c;
  size_t j;
  size_t i;
  size_t num_errors;
  ERR_SAVE_STATE *ret;
  ERR_STATE *state;
  
  pEVar1 = err_get_state();
  if ((pEVar1 == (ERR_STATE *)0x0) || (pEVar1->top == pEVar1->bottom)) {
    state = (ERR_STATE *)0x0;
  }
  else {
    state = (ERR_STATE *)malloc(0x10);
    if (state == (ERR_STATE *)0x0) {
      state = (ERR_STATE *)0x0;
    }
    else {
      if (pEVar1->top < pEVar1->bottom) {
        local_3c = (pEVar1->top + 0x10) - pEVar1->bottom;
      }
      else {
        local_3c = pEVar1->top - pEVar1->bottom;
      }
      pcVar2 = (char *)(ulong)local_3c;
      if ((char *)0xf < pcVar2) {
        __assert_fail("num_errors < ERR_NUM_ERRORS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                      ,0x303,"ERR_SAVE_STATE *ERR_save_state()");
      }
      pcVar3 = (char *)malloc((long)pcVar2 * 0x18);
      state->errors[0].file = pcVar3;
      if (state->errors[0].file == (char *)0x0) {
        free(state);
        state = (ERR_STATE *)0x0;
      }
      else {
        OPENSSL_memset(state->errors[0].file,0,(long)pcVar2 * 0x18);
        state->errors[0].data = pcVar2;
        for (j = 0; j < pcVar2; j = j + 1) {
          err_copy((err_error_st *)(state->errors[0].file + j * 0x18),
                   pEVar1->errors + (pEVar1->bottom + j + 1 & 0xf));
        }
      }
    }
  }
  return (ERR_SAVE_STATE *)state;
}

Assistant:

ERR_SAVE_STATE *ERR_save_state(void) {
  ERR_STATE *const state = err_get_state();
  if (state == NULL || state->top == state->bottom) {
    return NULL;
  }

  ERR_SAVE_STATE *ret =
      reinterpret_cast<ERR_SAVE_STATE *>(malloc(sizeof(ERR_SAVE_STATE)));
  if (ret == NULL) {
    return NULL;
  }

  // Errors are stored in the range (bottom, top].
  size_t num_errors = state->top >= state->bottom
                          ? state->top - state->bottom
                          : ERR_NUM_ERRORS + state->top - state->bottom;
  assert(num_errors < ERR_NUM_ERRORS);
  ret->errors = reinterpret_cast<err_error_st *>(
      malloc(num_errors * sizeof(struct err_error_st)));
  if (ret->errors == NULL) {
    free(ret);
    return NULL;
  }
  OPENSSL_memset(ret->errors, 0, num_errors * sizeof(struct err_error_st));
  ret->num_errors = num_errors;

  for (size_t i = 0; i < num_errors; i++) {
    size_t j = (state->bottom + i + 1) % ERR_NUM_ERRORS;
    err_copy(&ret->errors[i], &state->errors[j]);
  }
  return ret;
}